

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorMessage_DefaultErrorHasNoErrorMessage_Test::TestBody
          (ErrorTest_ErrorMessage_DefaultErrorHasNoErrorMessage_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  Message local_68;
  ErrorCode local_60 [5];
  ErrorCode local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  Error error;
  ErrorTest_ErrorMessage_DefaultErrorHasNoErrorMessage_Test *this_local;
  
  Error::Error((Error *)&gtest_ar.message_);
  local_4c = Error::GetCode((Error *)&gtest_ar.message_);
  local_60[0] = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_48,"error.GetCode()","ErrorCode::kNone",&local_4c,local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Error::GetMessage_abi_cxx11_((Error *)&gtest_ar.message_);
  local_81 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_80,(AssertionResult *)"error.GetMessage().empty()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  Error::~Error((Error *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ErrorTest, ErrorMessage_DefaultErrorHasNoErrorMessage)
{
    Error error;

    EXPECT_EQ(error.GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(error.GetMessage().empty());
}